

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::computeFrhs(SPxSolverBase<double> *this)

{
  bool bVar1;
  Representation RVar2;
  Type TVar3;
  int iVar4;
  Status SVar5;
  Status *pSVar6;
  double *pdVar7;
  ostream *poVar8;
  undefined8 uVar9;
  SPxSolverBase<double> *in_RDI;
  VectorBase<double> *in_stack_00000010;
  VectorBase<double> *in_stack_00000018;
  SPxSolverBase<double> *in_stack_00000020;
  double x_1;
  Status stat_1;
  int i_1;
  Desc *ds;
  Status stat;
  double x;
  int i;
  string *in_stack_ffffffffffffff48;
  SPxSolverBase<double> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar10;
  SVectorBase<double> *in_stack_ffffffffffffff60;
  double dVar11;
  double *in_stack_ffffffffffffff68;
  VectorBase<double> *in_stack_ffffffffffffff70;
  allocator *paVar12;
  double local_70;
  int local_64;
  allocator local_41;
  string local_40 [36];
  Status local_1c;
  double local_18;
  int local_c;
  
  RVar2 = rep(in_RDI);
  if (RVar2 == COLUMN) {
    VectorBase<double>::clear((VectorBase<double> *)in_stack_ffffffffffffff60);
    TVar3 = type(in_RDI);
    if (TVar3 == LEAVE) {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7a])();
      for (local_c = 0; iVar10 = local_c,
          iVar4 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x244adc), iVar10 < iVar4;
          local_c = local_c + 1) {
        SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
        pSVar6 = SPxBasisBase<double>::Desc::rowStatus
                           ((Desc *)in_stack_ffffffffffffff50,
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        local_1c = *pSVar6;
        bVar1 = isBasic(in_stack_ffffffffffffff50,(Status)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                       );
        if (!bVar1) {
          iVar10 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
          switch(local_1c) {
          case P_FIXED:
          case P_ON_UPPER:
            pdVar7 = SPxLPBase<double>::rhs
                               (&in_stack_ffffffffffffff50->super_SPxLPBase<double>,iVar10);
            local_18 = *pdVar7;
            break;
          default:
            poVar8 = std::operator<<((ostream *)&std::cerr,"ESVECS01 ERROR: ");
            poVar8 = std::operator<<(poVar8,"inconsistent basis must not happen!");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            uVar9 = __cxa_allocate_exception(0x28);
            paVar12 = &local_41;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_40,"XSVECS01 This should never happen.",paVar12);
            SPxInternalCodeException::SPxInternalCodeException
                      ((SPxInternalCodeException *)in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff48);
            __cxa_throw(uVar9,&SPxInternalCodeException::typeinfo,
                        SPxInternalCodeException::~SPxInternalCodeException);
          case P_ON_LOWER:
            pdVar7 = SPxLPBase<double>::lhs
                               (&in_stack_ffffffffffffff50->super_SPxLPBase<double>,iVar10);
            local_18 = *pdVar7;
            break;
          case P_FREE:
            goto LAB_00244cc4;
          }
          dVar11 = local_18;
          pdVar7 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff50,
                              (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          *pdVar7 = dVar11 + *pdVar7;
        }
LAB_00244cc4:
      }
    }
    else {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7b])
                (in_RDI,in_RDI->theUbound,in_RDI->theLbound);
      computeFrhs2(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    }
  }
  else {
    TVar3 = type(in_RDI);
    if (TVar3 == ENTER) {
      VectorBase<double>::clear((VectorBase<double> *)in_stack_ffffffffffffff60);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7b])
                (in_RDI,in_RDI->theUbound,in_RDI->theLbound);
      computeFrhs2(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      SPxLPBase<double>::maxObj((SPxLPBase<double> *)0x244d73);
      VectorBase<double>::operator+=
                ((VectorBase<double> *)in_stack_ffffffffffffff60,
                 (VectorBase<double> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                );
    }
    else {
      SPxLPBase<double>::maxObj((SPxLPBase<double> *)0x244d96);
      VectorBase<double>::operator=
                ((VectorBase<double> *)in_stack_ffffffffffffff50,
                 (VectorBase<double> *)in_stack_ffffffffffffff48);
      SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
      local_64 = 0;
      while (iVar10 = local_64, iVar4 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x244dda),
            iVar10 < iVar4) {
        SVar5 = SPxBasisBase<double>::Desc::rowStatus
                          ((Desc *)in_stack_ffffffffffffff50,
                           (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        bVar1 = isBasic(in_stack_ffffffffffffff50,(Status)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                       );
        if (!bVar1) {
          in_stack_ffffffffffffff50 = (SPxSolverBase<double> *)(ulong)(uint)(SVar5 + P_FREE);
          switch(in_stack_ffffffffffffff50) {
          case (SPxSolverBase<double> *)0x0:
            goto LAB_00244e9d;
          case (SPxSolverBase<double> *)0x1:
          case (SPxSolverBase<double> *)0x3:
          case (SPxSolverBase<double> *)0x5:
            pdVar7 = SPxLPBase<double>::maxRowObj
                               ((SPxLPBase<double> *)in_stack_ffffffffffffff50,
                                (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            local_70 = *pdVar7;
            break;
          default:
            local_70 = 0.0;
          }
          if ((local_70 != 0.0) || (NAN(local_70))) {
            in_stack_ffffffffffffff48 = (string *)in_RDI->theFrhs;
            vector(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            VectorBase<double>::multAdd<double,double>
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                      );
          }
        }
LAB_00244e9d:
        local_64 = local_64 + 1;
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhs()
{

   if(rep() == COLUMN)
   {
      theFrhs->clear();

      if(type() == LEAVE)
      {
         computeFrhsXtra();

         for(int i = 0; i < this->nRows(); i++)
         {
            R x;

            typename SPxBasisBase<R>::Desc::Status stat = this->desc().rowStatus(i);

            if(!isBasic(stat))
            {
               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               // columnwise cases:
               case SPxBasisBase<R>::Desc::P_FREE :
                  continue;

               case(SPxBasisBase<R>::Desc::P_FIXED) :
                  assert(EQ(this->lhs(i), this->rhs(i), this->epsilon()));

               //lint -fallthrough
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  x = this->rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  x = this->lhs(i);
                  break;

               default:
                  SPX_MSG_ERROR(std::cerr << "ESVECS01 ERROR: "
                                << "inconsistent basis must not happen!"
                                << std::endl;)
                  throw SPxInternalCodeException("XSVECS01 This should never happen.");
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               (*theFrhs)[i] += x;     // slack !
            }
         }
      }
      else
      {
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
      }
   }
   else
   {
      assert(rep() == ROW);

      if(type() == ENTER)
      {
         theFrhs->clear();
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
         *theFrhs += this->maxObj();
      }
      else
      {
         ///@todo put this into a separate method
         *theFrhs = this->maxObj();
         const typename SPxBasisBase<R>::Desc& ds = this->desc();

         for(int i = 0; i < this->nRows(); ++i)
         {
            typename SPxBasisBase<R>::Desc::Status stat = ds.rowStatus(i);

            if(!isBasic(stat))
            {
               R x;

               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               case SPxBasisBase<R>::Desc::D_FREE :
                  continue;

               case SPxBasisBase<R>::Desc::D_ON_UPPER :
               case SPxBasisBase<R>::Desc::D_ON_LOWER :
               case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
                  x = this->maxRowObj(i);
                  break;

               default:
                  assert(this->lhs(i) <= R(-infinity) && this->rhs(i) >= R(infinity));
                  x = 0.0;
                  break;
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               // assert(x == 0.0);

               if(x != 0.0)
                  theFrhs->multAdd(x, vector(i));
            }
         }
      }
   }
}